

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean read_scan_integer(FILE *file,long *result,int *termchar)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  boolean bVar6;
  bool bVar7;
  
  bVar2 = read_text_integer(file,result,termchar);
  bVar6 = 0;
  if (bVar2 != 0) {
    iVar3 = *termchar;
    bVar7 = (long)iVar3 != -1;
    if (bVar7) {
      ppuVar4 = __ctype_b_loc();
      bVar1 = *(byte *)((long)*ppuVar4 + (long)iVar3 * 2 + 1);
      while ((bVar1 & 0x20) != 0) {
        iVar3 = text_getc(file);
        bVar7 = iVar3 != -1;
        if (iVar3 == -1) break;
        bVar1 = *(byte *)((long)*ppuVar4 + (long)iVar3 * 2 + 1);
      }
    }
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (long)iVar3 * 2 + 1) & 8) == 0) {
      iVar5 = 0x20;
      if (0xfffffffd < iVar3 - 0x3cU) {
        iVar5 = iVar3;
      }
      if (!bVar7) {
        iVar5 = iVar3;
      }
    }
    else {
      iVar3 = ungetc(iVar3,(FILE *)file);
      iVar5 = 0x20;
      if (iVar3 == -1) {
        return 0;
      }
    }
    *termchar = iVar5;
    bVar6 = 1;
  }
  return bVar6;
}

Assistant:

LOCAL(boolean)
read_scan_integer(FILE *file, long *result, int *termchar)
/* Variant of read_text_integer that always looks for a non-space termchar;
 * this simplifies parsing of punctuation in scan scripts.
 */
{
  register int ch;

  if (!read_text_integer(file, result, termchar))
    return FALSE;
  ch = *termchar;
  while (ch != EOF && isspace(ch))
    ch = text_getc(file);
  if (isdigit(ch)) {            /* oops, put it back */
    if (ungetc(ch, file) == EOF)
      return FALSE;
    ch = ' ';
  } else {
    /* Any separators other than ';' and ':' are ignored;
     * this allows user to insert commas, etc, if desired.
     */
    if (ch != EOF && ch != ';' && ch != ':')
      ch = ' ';
  }
  *termchar = ch;
  return TRUE;
}